

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_choice.hpp
# Opt level: O3

result_type_conflict1 __thiscall
bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
          (random_choice_walker<unsigned_long,unsigned_int,double,void> *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *eng)

{
  result_type rVar1;
  result_type_conflict1 rVar2;
  ulong uVar3;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(eng);
  uVar3 = rVar1 >> ((byte)*this & 0x3f);
  rVar2 = (result_type_conflict1)uVar3;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(eng);
  uVar3 = uVar3 & 0xffffffff;
  if (*(uint *)(*(long *)(this + 8) + uVar3 * 8) <= rVar1) {
    rVar2 = *(result_type_conflict1 *)(*(long *)(this + 8) + 4 + uVar3 * 8);
  }
  return rVar2;
}

Assistant:

result_type operator()(Engine& eng) const {
    result_type x = eng() >> bits_;
    return (eng() < cutoff(x)) ? x : alias(x);
  }